

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

bool __thiscall CEntity::GameLayerClipped(CEntity *this,vec2 CheckPos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CGameContext *pCVar4;
  CCollision *pCVar5;
  float in_XMM0_Da;
  float in_XMM0_Db;
  int ry;
  int rx;
  undefined1 local_2d;
  undefined1 local_19;
  
  iVar1 = round_to_int(in_XMM0_Da);
  iVar2 = round_to_int(in_XMM0_Db);
  local_19 = true;
  if (-0xc9 < iVar1 / 0x20) {
    pCVar4 = GameServer((CEntity *)0x11e9b1);
    pCVar5 = CGameContext::Collision(pCVar4);
    iVar3 = CCollision::GetWidth(pCVar5);
    local_19 = true;
    if (iVar1 / 0x20 < iVar3 + 200) {
      local_2d = true;
      if (-0xc9 < iVar2 / 0x20) {
        pCVar4 = GameServer((CEntity *)0x11e9f9);
        pCVar5 = CGameContext::Collision(pCVar4);
        iVar1 = CCollision::GetHeight(pCVar5);
        local_2d = iVar1 + 200 <= iVar2 / 0x20;
      }
      local_19 = local_2d;
    }
  }
  return local_19;
}

Assistant:

bool CEntity::GameLayerClipped(vec2 CheckPos)
{
	int rx = round_to_int(CheckPos.x) / 32;
	int ry = round_to_int(CheckPos.y) / 32;
	return (rx < -200 || rx >= GameServer()->Collision()->GetWidth()+200)
			|| (ry < -200 || ry >= GameServer()->Collision()->GetHeight()+200);
}